

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O0

uint fl_old_shortcut(char *s)

{
  char *pcVar1;
  long lVar2;
  uint local_1c;
  char *pcStack_18;
  uint n;
  char *s_local;
  
  if ((s == (char *)0x0) || (*s == '\0')) {
    s_local._4_4_ = 0;
  }
  else {
    if ((s[1] == '\0') && (pcVar1 = strchr("@!",(int)*s), pcVar1 != (char *)0x0)) {
      return (int)*s;
    }
    local_1c = 0;
    pcStack_18 = s;
    if (*s == '#') {
      local_1c = 0x80000;
      pcStack_18 = s + 1;
    }
    if (*pcStack_18 == '+') {
      local_1c = local_1c | 0x10000;
      pcStack_18 = pcStack_18 + 1;
    }
    if (*pcStack_18 == '^') {
      local_1c = local_1c | 0x40000;
      pcStack_18 = pcStack_18 + 1;
    }
    if (*pcStack_18 == '!') {
      local_1c = local_1c | 0x400000;
      pcStack_18 = pcStack_18 + 1;
    }
    if (*pcStack_18 == '@') {
      local_1c = local_1c | 0x40000;
      pcStack_18 = pcStack_18 + 1;
    }
    if ((*pcStack_18 == '\0') || (pcStack_18[1] == '\0')) {
      s_local._4_4_ = local_1c | (int)*pcStack_18;
    }
    else {
      lVar2 = strtol(pcStack_18,(char **)0x0,0);
      s_local._4_4_ = local_1c | (uint)lVar2;
    }
  }
  return s_local._4_4_;
}

Assistant:

unsigned int fl_old_shortcut(const char* s) {
  if (!s || !*s) return 0;
  if (s[1]==0 && strchr("@!",s[0])) return s[0]; // maintain legacy behavior for "!" and "@"
  unsigned int n = 0;
  if (*s == '#') {n |= FL_ALT; s++;}
  if (*s == '+') {n |= FL_SHIFT; s++;}
  if (*s == '^') {n |= FL_CTRL; s++;}
  if (*s == '!') {n |= FL_META; s++;} 	 // added in 1.3.3
  if (*s == '@') {n |= FL_COMMAND; s++;} // added in 1.3.3
  if (*s && s[1]) return n | (int)strtol(s,0,0); // allow 0xf00 to get any key
  return n | *s;
}